

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  int32 iVar2;
  int iVar3;
  cmd_ln_t *pcVar4;
  char *pcVar5;
  uint32 *ts2cb;
  ulong uVar6;
  uint n_cb;
  model_def_t *mdef;
  
  parse_cmd_ln(argc,argv);
  pcVar4 = cmd_ln_get();
  pcVar5 = cmd_ln_str_r(pcVar4,"-moddeffn");
  n_cb = 1;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_ts2cb/main.c"
          ,0x48,"Reading model definition file %s\n",pcVar5);
  pcVar4 = cmd_ln_get();
  pcVar5 = cmd_ln_str_r(pcVar4,"-moddeffn");
  iVar2 = model_def_read(&mdef,pcVar5);
  if (iVar2 == 0) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_ts2cb/main.c"
            ,0x4e,"%d tied states defined\n",(ulong)mdef->n_tied_state);
    pcVar4 = cmd_ln_get();
    pcVar5 = cmd_ln_str_r(pcVar4,"-tyingtype");
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_ts2cb/main.c"
            ,0x52,"Generating state parameter definitions for %s tying\n",pcVar5);
    ts2cb = (uint32 *)
            __ckd_calloc__((ulong)mdef->n_tied_state,4,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_ts2cb/main.c"
                           ,0x54);
    iVar3 = strcmp(pcVar5,"semi");
    if (iVar3 != 0) {
      if (((*pcVar5 == 'p') && (pcVar5[1] == 'd')) && (pcVar5[2] == '\0')) {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_ts2cb/main.c"
                ,0x5a,"Phone dependent codebooks not yet implemented\n");
        exit(1);
      }
      iVar3 = strcmp(pcVar5,"cont");
      if (iVar3 != 0) {
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_ts2cb/main.c"
                ,99,"Unknown tying type %s given\n",pcVar5);
        goto LAB_001026c2;
      }
      n_cb = mdef->n_tied_state;
      uVar1 = n_cb;
      for (uVar6 = 0; uVar6 < uVar1; uVar6 = uVar6 + 1) {
        ts2cb[uVar6] = (uint32)uVar6;
        uVar1 = mdef->n_tied_state;
      }
    }
    pcVar4 = cmd_ln_get();
    pcVar5 = cmd_ln_str_r(pcVar4,"-ts2cbfn");
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_ts2cb/main.c"
            ,0x66,"Writing %s\n",pcVar5);
    pcVar4 = cmd_ln_get();
    pcVar5 = cmd_ln_str_r(pcVar4,"-ts2cbfn");
    iVar3 = s3ts2cb_write(pcVar5,ts2cb,mdef->n_tied_state,n_cb);
    if (iVar3 == 0) {
      return 0;
    }
    pcVar4 = cmd_ln_get();
    pcVar5 = cmd_ln_str_r(pcVar4,"-ts2cbfn");
    err_msg_system(ERR_FATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_ts2cb/main.c"
                   ,0x6c,"Unable to write %s\n",pcVar5);
  }
LAB_001026c2:
  exit(1);
}

Assistant:

int
main(int argc, char *argv[])
{
    uint32 *spd;
    model_def_t *mdef;
    const char *tying_type;
    uint32 i;
    uint32 n_cb=0;
    
    parse_cmd_ln(argc, argv);

    E_INFO("Reading model definition file %s\n", cmd_ln_str("-moddeffn"));
    
    if (model_def_read(&mdef, cmd_ln_str("-moddeffn")) != S3_SUCCESS) {
	exit(1);
    }

    E_INFO("%d tied states defined\n", mdef->n_tied_state);

    tying_type = cmd_ln_str("-tyingtype");

    E_INFO("Generating state parameter definitions for %s tying\n", tying_type);
    
    spd = ckd_calloc(mdef->n_tied_state, sizeof(uint32));

    if (strcmp(tying_type, "semi") == 0) {
	n_cb = 1;
    }
    else if (strcmp(tying_type, "pd") == 0) {
	E_INFO("Phone dependent codebooks not yet implemented\n");
	exit(1);
    }
    else if (strcmp(tying_type, "cont") == 0) {
	n_cb = mdef->n_tied_state;
	for (i = 0; i < mdef->n_tied_state; i++)
	    spd[i] = i;
    }
    else {
	E_FATAL("Unknown tying type %s given\n", tying_type);
    }

    E_INFO("Writing %s\n", cmd_ln_str("-ts2cbfn"));

    if (s3ts2cb_write(cmd_ln_str("-ts2cbfn"),
		      spd,
		      mdef->n_tied_state,
		      n_cb) != S3_SUCCESS) {
	E_FATAL_SYSTEM("Unable to write %s\n", cmd_ln_str("-ts2cbfn"));
    }

    return 0;
}